

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::MergePartialFromCodedStream
          (RandomUniformStaticLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  char cVar5;
  ulong uVar6;
  float *value;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001ca2b1;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001ca2b1:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    uVar4 = (uint32)uVar6;
    if ((uVar6 & 0x100000000) == 0) goto switchD_001ca30b_default;
    cVar5 = (char)uVar6;
    switch((uint)(uVar6 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar5 != '\b') goto switchD_001ca30b_default;
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                        (input,&this->seed_);
      break;
    case 2:
      value = &this->minval_;
      if (cVar5 != '\x15') goto switchD_001ca30b_default;
LAB_001ca357:
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,value);
      break;
    case 3:
      value = &this->maxval_;
      if (cVar5 == '\x1d') goto LAB_001ca357;
    default:
switchD_001ca30b_default:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
      break;
    case 4:
      if (cVar5 == ' ') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (1,0x22,input,&this->outputshape_);
      }
      else {
        if ((uVar4 & 0xff) != 0x22) goto switchD_001ca30b_default;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->outputshape_);
      }
    }
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool RandomUniformStaticLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.RandomUniformStaticLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float minVal = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &minval_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float maxVal = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &maxval_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 outputShape = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_outputshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 34u, input, this->mutable_outputshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.RandomUniformStaticLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.RandomUniformStaticLayerParams)
  return false;
#undef DO_
}